

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.h
# Opt level: O3

Point3f __thiscall
pbrt::TransformMapping3D::Map
          (TransformMapping3D *this,TextureEvalContext ctx,Vector3f *dpdx,Vector3f *dpdy)

{
  undefined8 uVar1;
  bool bVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  Point3f PVar11;
  
  auVar7 = vfmadd231ss_fma(ZEXT416((uint)(ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.y *
                                         (this->textureFromRender).m.m[0][1])),
                           ZEXT416((uint)ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.x),
                           ZEXT416((uint)(this->textureFromRender).m.m[0][0]));
  auVar8 = vfmadd231ss_fma(ZEXT416((uint)(ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.y *
                                         (this->textureFromRender).m.m[1][1])),
                           ZEXT416((uint)ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.x),
                           ZEXT416((uint)(this->textureFromRender).m.m[1][0]));
  auVar9 = vfmadd231ss_fma(ZEXT416((uint)(ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.y *
                                         (this->textureFromRender).m.m[2][1])),
                           ZEXT416((uint)ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.x),
                           ZEXT416((uint)(this->textureFromRender).m.m[2][0]));
  auVar7 = vfmadd231ss_fma(auVar7,ZEXT416((uint)ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.z),
                           ZEXT416((uint)(this->textureFromRender).m.m[0][2]));
  auVar8 = vfmadd231ss_fma(auVar8,ZEXT416((uint)ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.z),
                           ZEXT416((uint)(this->textureFromRender).m.m[1][2]));
  auVar9 = vfmadd231ss_fma(auVar9,ZEXT416((uint)ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.z),
                           ZEXT416((uint)(this->textureFromRender).m.m[2][2]));
  auVar7 = vinsertps_avx(auVar7,auVar8,0x10);
  uVar1 = vmovlps_avx(auVar7);
  (dpdx->super_Tuple3<pbrt::Vector3,_float>).x = (float)(int)uVar1;
  (dpdx->super_Tuple3<pbrt::Vector3,_float>).y = (float)(int)((ulong)uVar1 >> 0x20);
  (dpdx->super_Tuple3<pbrt::Vector3,_float>).z = auVar9._0_4_;
  auVar7 = vfmadd231ss_fma(ZEXT416((uint)(ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.y *
                                         (this->textureFromRender).m.m[0][1])),
                           ZEXT416((uint)ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.x),
                           ZEXT416((uint)(this->textureFromRender).m.m[0][0]));
  auVar8 = vfmadd231ss_fma(ZEXT416((uint)(ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.y *
                                         (this->textureFromRender).m.m[1][1])),
                           ZEXT416((uint)ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.x),
                           ZEXT416((uint)(this->textureFromRender).m.m[1][0]));
  auVar9 = vfmadd231ss_fma(ZEXT416((uint)(ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.y *
                                         (this->textureFromRender).m.m[2][1])),
                           ZEXT416((uint)ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.x),
                           ZEXT416((uint)(this->textureFromRender).m.m[2][0]));
  auVar7 = vfmadd231ss_fma(auVar7,ZEXT416((uint)ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.z),
                           ZEXT416((uint)(this->textureFromRender).m.m[0][2]));
  auVar8 = vfmadd231ss_fma(auVar8,ZEXT416((uint)ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.z),
                           ZEXT416((uint)(this->textureFromRender).m.m[1][2]));
  auVar9 = vfmadd231ss_fma(auVar9,ZEXT416((uint)ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.z),
                           ZEXT416((uint)(this->textureFromRender).m.m[2][2]));
  auVar7 = vinsertps_avx(auVar7,auVar8,0x10);
  uVar1 = vmovlps_avx(auVar7);
  (dpdy->super_Tuple3<pbrt::Vector3,_float>).x = (float)(int)uVar1;
  (dpdy->super_Tuple3<pbrt::Vector3,_float>).y = (float)(int)((ulong)uVar1 >> 0x20);
  (dpdy->super_Tuple3<pbrt::Vector3,_float>).z = auVar9._0_4_;
  auVar7 = vfmadd231ss_fma(ZEXT416((uint)(ctx.p.super_Tuple3<pbrt::Point3,_float>.y *
                                         (this->textureFromRender).m.m[0][1])),
                           ZEXT416((uint)ctx.p.super_Tuple3<pbrt::Point3,_float>.x),
                           ZEXT416((uint)(this->textureFromRender).m.m[0][0]));
  auVar8 = vfmadd231ss_fma(ZEXT416((uint)(ctx.p.super_Tuple3<pbrt::Point3,_float>.y *
                                         (this->textureFromRender).m.m[1][1])),
                           ZEXT416((uint)ctx.p.super_Tuple3<pbrt::Point3,_float>.x),
                           ZEXT416((uint)(this->textureFromRender).m.m[1][0]));
  auVar9 = vfmadd231ss_fma(ZEXT416((uint)(ctx.p.super_Tuple3<pbrt::Point3,_float>.y *
                                         (this->textureFromRender).m.m[3][1])),
                           ZEXT416((uint)ctx.p.super_Tuple3<pbrt::Point3,_float>.x),
                           ZEXT416((uint)(this->textureFromRender).m.m[3][0]));
  auVar10 = vfmadd231ss_fma(ZEXT416((uint)(ctx.p.super_Tuple3<pbrt::Point3,_float>.y *
                                          (this->textureFromRender).m.m[2][1])),
                            ZEXT416((uint)ctx.p.super_Tuple3<pbrt::Point3,_float>.x),
                            ZEXT416((uint)(this->textureFromRender).m.m[2][0]));
  auVar7 = vfmadd231ss_fma(auVar7,ZEXT416((uint)ctx.p.super_Tuple3<pbrt::Point3,_float>.z),
                           ZEXT416((uint)(this->textureFromRender).m.m[0][2]));
  auVar8 = vfmadd231ss_fma(auVar8,ZEXT416((uint)ctx.p.super_Tuple3<pbrt::Point3,_float>.z),
                           ZEXT416((uint)(this->textureFromRender).m.m[1][2]));
  auVar9 = vfmadd231ss_fma(auVar9,ZEXT416((uint)ctx.p.super_Tuple3<pbrt::Point3,_float>.z),
                           ZEXT416((uint)(this->textureFromRender).m.m[3][2]));
  auVar10 = vfmadd231ss_fma(auVar10,ZEXT416((uint)ctx.p.super_Tuple3<pbrt::Point3,_float>.z),
                            ZEXT416((uint)(this->textureFromRender).m.m[2][2]));
  fVar3 = auVar9._0_4_ + (this->textureFromRender).m.m[3][3];
  fVar4 = auVar7._0_4_ + (this->textureFromRender).m.m[0][3];
  fVar5 = auVar8._0_4_ + (this->textureFromRender).m.m[1][3];
  fVar6 = auVar10._0_4_ + (this->textureFromRender).m.m[2][3];
  bVar2 = fVar3 == 1.0;
  auVar7 = vinsertps_avx(ZEXT416((uint)bVar2 * (int)fVar4 + (uint)!bVar2 * (int)(fVar4 / fVar3)),
                         ZEXT416((uint)bVar2 * (int)fVar5 + (uint)!bVar2 * (int)(fVar5 / fVar3)),
                         0x10);
  PVar11.super_Tuple3<pbrt::Point3,_float>._0_8_ = auVar7._0_8_;
  PVar11.super_Tuple3<pbrt::Point3,_float>.z =
       (float)((uint)bVar2 * (int)fVar6 + (uint)!bVar2 * (int)(fVar6 / fVar3));
  return (Point3f)PVar11.super_Tuple3<pbrt::Point3,_float>;
}

Assistant:

inline Vector3<T> Transform::operator()(const Vector3<T> &v) const {
    T x = v.x, y = v.y, z = v.z;
    return Vector3<T>(m[0][0] * x + m[0][1] * y + m[0][2] * z,
                      m[1][0] * x + m[1][1] * y + m[1][2] * z,
                      m[2][0] * x + m[2][1] * y + m[2][2] * z);
}